

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat.cpp
# Opt level: O2

bool __thiscall SAT::simplify(SAT *this,Clause *c)

{
  char cVar1;
  char cVar2;
  Lit *pLVar3;
  Lit *pLVar4;
  bool bVar5;
  uint newSize;
  uint i;
  
  pLVar3 = Clause::operator[](c,0);
  cVar1 = (this->assigns).data[(uint)(pLVar3->x >> 1)];
  cVar2 = -cVar1;
  if ((pLVar3->x & 1U) == 0) {
    cVar2 = cVar1;
  }
  bVar5 = true;
  if (cVar2 != ::l_True.value) {
    pLVar3 = Clause::operator[](c,1);
    cVar1 = (this->assigns).data[(uint)(pLVar3->x >> 1)];
    cVar2 = -cVar1;
    if ((pLVar3->x & 1U) == 0) {
      cVar2 = cVar1;
    }
    if (cVar2 != ::l_True.value) {
      newSize = 2;
      for (i = 2; i < *(uint *)c >> 8; i = i + 1) {
        pLVar3 = Clause::operator[](c,i);
        cVar1 = (this->assigns).data[(uint)(pLVar3->x >> 1)];
        cVar2 = -cVar1;
        if ((pLVar3->x & 1U) == 0) {
          cVar2 = cVar1;
        }
        if (cVar2 == ::l_True.value) {
          return true;
        }
        pLVar3 = Clause::operator[](c,i);
        cVar1 = (this->assigns).data[(uint)(pLVar3->x >> 1)];
        cVar2 = -cVar1;
        if ((pLVar3->x & 1U) == 0) {
          cVar2 = cVar1;
        }
        if (cVar2 == ::l_Undef.value) {
          pLVar3 = Clause::operator[](c,i);
          pLVar4 = Clause::operator[](c,newSize);
          pLVar4->x = pLVar3->x;
          newSize = newSize + 1;
        }
      }
      Clause::resize(c,newSize);
      bVar5 = false;
    }
  }
  return bVar5;
}

Assistant:

bool SAT::simplify(Clause& c) const {
	if (value(c[0]) == l_True) {
		return true;
	}
	if (value(c[1]) == l_True) {
		return true;
	}
	unsigned int i;
	unsigned int j;
	for (i = j = 2; i < c.size(); i++) {
		if (value(c[i]) == l_True) {
			return true;
		}
		if (value(c[i]) == l_Undef) {
			c[j++] = c[i];
		}
	}
	c.resize(j);
	return false;
}